

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<JsUtil::CharacterBuffer<char16_t>,JsUtil::CharacterBuffer<char16_t>,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
::FindEntryWithKey<JsUtil::CharacterBuffer<char16_t>>
          (BaseDictionary<JsUtil::CharacterBuffer<char16_t>,JsUtil::CharacterBuffer<char16_t>,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
           *this,CharacterBuffer<char16_t> *key)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  hash_t hVar4;
  uint uVar5;
  hash_t extraout_EDX;
  hash_t extraout_EDX_00;
  DictionaryStats *this_00;
  int iVar6;
  DefaultHashedEntry<JsUtil::CharacterBuffer<char16_t>,JsUtil::CharacterBuffer<char16_t>,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
  *pDVar7;
  
  lVar1 = *(long *)this;
  if (lVar1 == 0) {
    uVar5 = 0;
  }
  else {
    hVar4 = GetHashCodeWithKey<JsUtil::CharacterBuffer<char16_t>>(key);
    uVar5 = BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::GetBucket((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                         *)this,hVar4);
    lVar2 = *(long *)(this + 8);
    pDVar7 = (DefaultHashedEntry<JsUtil::CharacterBuffer<char16_t>,JsUtil::CharacterBuffer<char16_t>,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
              *)(lVar1 + (ulong)uVar5 * 4);
    uVar5 = 0;
    hVar4 = extraout_EDX;
    while( true ) {
      iVar6 = *(int *)pDVar7;
      if ((long)iVar6 < 0) break;
      pDVar7 = (DefaultHashedEntry<JsUtil::CharacterBuffer<char16_t>,JsUtil::CharacterBuffer<char16_t>,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                *)((long)iVar6 * 0x18 + lVar2);
      bVar3 = DefaultHashedEntry<JsUtil::CharacterBuffer<char16_t>,JsUtil::CharacterBuffer<char16_t>,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
              ::
              KeyEquals<DefaultComparer<JsUtil::CharacterBuffer<char16_t>>,JsUtil::CharacterBuffer<char16_t>>
                        (pDVar7,key,hVar4);
      if (bVar3) {
        this_00 = *(DictionaryStats **)(this + 0x30);
        goto LAB_00a12f64;
      }
      uVar5 = uVar5 + 1;
      pDVar7 = pDVar7 + 0x10;
      hVar4 = extraout_EDX_00;
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  iVar6 = -1;
LAB_00a12f64:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar5);
  }
  return iVar6;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }